

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array_slice.cpp
# Opt level: O3

list_entry_t __thiscall
duckdb::ListSliceOperations::SliceValueWithSteps
          (ListSliceOperations *this,Vector *result,SelectionVector *sel,list_entry_t input,
          int64_t begin,int64_t end,int64_t step,idx_t *sel_idx)

{
  long lVar1;
  idx_t iVar2;
  uint64_t uVar3;
  int iVar4;
  idx_t iVar5;
  list_entry_t lVar6;
  
  if (begin == input.length) {
    uVar3 = *(uint64_t *)step;
  }
  else {
    iVar2 = CalculateSliceLength<long>(input.length,begin,end,true);
    uVar3 = *(uint64_t *)step;
    if (iVar2 != 0) {
      iVar4 = (int)sel + -1 + (int)begin;
      if (-1 < end) {
        iVar4 = (int)input.length + (int)sel;
      }
      lVar1 = *(long *)result;
      iVar5 = 0;
      do {
        *(int *)(uVar3 * 4 + lVar1 + iVar5 * 4) = iVar4;
        iVar5 = iVar5 + 1;
        iVar4 = iVar4 + (int)end;
      } while (iVar2 != iVar5);
      *(idx_t *)step = iVar5 + uVar3;
      goto LAB_0069fa23;
    }
  }
  iVar2 = 0;
LAB_0069fa23:
  lVar6.length = iVar2;
  lVar6.offset = uVar3;
  return lVar6;
}

Assistant:

static list_entry_t SliceValueWithSteps(Vector &result, SelectionVector &sel, list_entry_t input, int64_t begin,
	                                        int64_t end, int64_t step, idx_t &sel_idx) {
		if (end - begin == 0) {
			input.length = 0;
			input.offset = sel_idx;
			return input;
		}
		input.length = CalculateSliceLength(UnsafeNumericCast<idx_t>(begin), UnsafeNumericCast<idx_t>(end), step, true);
		idx_t child_idx = input.offset + UnsafeNumericCast<idx_t>(begin);
		if (step < 0) {
			child_idx = input.offset + UnsafeNumericCast<idx_t>(end) - 1;
		}
		input.offset = sel_idx;
		for (idx_t i = 0; i < input.length; i++) {
			sel.set_index(sel_idx, child_idx);
			child_idx += static_cast<idx_t>(step); // intentional overflow??
			sel_idx++;
		}
		return input;
	}